

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::a64::ARMRAPass::emitSave(ARMRAPass *this,uint32_t workId,uint32_t srcPhysId)

{
  bool bVar1;
  Error EVar2;
  RAWorkReg *this_00;
  char *comment;
  BaseReg srcReg;
  BaseMem dstMem;
  RAWorkReg *wReg;
  char *in_stack_000001b8;
  TypeId in_stack_000001c7;
  Operand_ *in_stack_000001c8;
  Operand_ *in_stack_000001d0;
  EmitHelper *in_stack_000001d8;
  undefined4 in_stack_ffffffffffffff88;
  DiagnosticOptions in_stack_ffffffffffffff8c;
  BaseRAPass *in_stack_ffffffffffffff90;
  RAWorkReg *in_stack_ffffffffffffffb0;
  BaseRAPass *in_stack_ffffffffffffffb8;
  
  this_00 = BaseRAPass::workRegById(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  BaseRAPass::workRegAsMem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  RAWorkReg::signature(this_00);
  BaseReg::BaseReg((BaseReg *)in_stack_ffffffffffffff90,
                   (Signature *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  bVar1 = BaseRAPass::hasDiagnosticOption(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (bVar1) {
    BaseRAPass::workRegById(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    RAWorkReg::name((RAWorkReg *)0x173a10);
    String::assignFormat<char_const*>
              ((String *)in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char **)0x173a2b);
    String::data((String *)in_stack_ffffffffffffff90);
  }
  RAWorkReg::typeId((RAWorkReg *)0x173a5b);
  EVar2 = EmitHelper::emitRegMove
                    (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c7,
                     in_stack_000001b8);
  return EVar2;
}

Assistant:

Error ARMRAPass::emitSave(uint32_t workId, uint32_t srcPhysId) noexcept {
  RAWorkReg* wReg = workRegById(workId);
  BaseMem dstMem(workRegAsMem(wReg));
  BaseReg srcReg(wReg->signature(), srcPhysId);

  const char* comment = nullptr;

#ifndef ASMJIT_NO_LOGGING
  if (hasDiagnosticOption(DiagnosticOptions::kRAAnnotate)) {
    _tmpString.assignFormat("<SAVE> %s", workRegById(workId)->name());
    comment = _tmpString.data();
  }
#endif

  return _emitHelper.emitRegMove(dstMem, srcReg, wReg->typeId(), comment);
}